

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

void __thiscall OPLmusicFile::~OPLmusicFile(OPLmusicFile *this)

{
  BYTE *pBVar1;
  
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_006e9d78;
  if ((this->super_OPLmusicBlock).super_musicBlock.scoredata != (BYTE *)0x0) {
    (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[3])();
    pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    if (pBVar1 != (BYTE *)0x0) {
      operator_delete__(pBVar1);
    }
    (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
  }
  OPLmusicBlock::~OPLmusicBlock(&this->super_OPLmusicBlock);
  return;
}

Assistant:

OPLmusicFile::~OPLmusicFile ()
{
	if (scoredata != NULL)
	{
		io->OPLdeinit ();
		delete[] scoredata;
		scoredata = NULL;
	}
}